

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O2

void plutovg_path_add_ellipse(plutovg_path_t *path,float cx,float cy,float rx,float ry)

{
  float fVar1;
  float y2;
  float x1;
  float y1;
  float y2_00;
  float x2;
  float y;
  
  x2 = cx - rx;
  y = cy - ry;
  fVar1 = cx + rx;
  y2 = cy + ry;
  plutovg_path_reserve(path,0x14);
  plutovg_path_move_to(path,cx,y);
  x1 = rx * 0.5522848 + cx;
  y2_00 = cy - ry * 0.5522848;
  plutovg_path_cubic_to(path,x1,y,fVar1,y2_00,fVar1,cy);
  y1 = ry * 0.5522848 + cy;
  plutovg_path_cubic_to(path,fVar1,y1,x1,y2,cx,y2);
  fVar1 = cx - rx * 0.5522848;
  plutovg_path_cubic_to(path,fVar1,y2,x2,y1,x2,cy);
  plutovg_path_cubic_to(path,x2,y2_00,fVar1,y,cx,y);
  plutovg_path_close(path);
  return;
}

Assistant:

void plutovg_path_add_ellipse(plutovg_path_t* path, float cx, float cy, float rx, float ry)
{
    float left = cx - rx;
    float top = cy - ry;
    float right = cx + rx;
    float bottom = cy + ry;

    float cpx = rx * PLUTOVG_KAPPA;
    float cpy = ry * PLUTOVG_KAPPA;

    plutovg_path_reserve(path, 2 * 2 + 4 * 4);
    plutovg_path_move_to(path, cx, top);
    plutovg_path_cubic_to(path, cx+cpx, top, right, cy-cpy, right, cy);
    plutovg_path_cubic_to(path, right, cy+cpy, cx+cpx, bottom, cx, bottom);
    plutovg_path_cubic_to(path, cx-cpx, bottom, left, cy+cpy, left, cy);
    plutovg_path_cubic_to(path, left, cy-cpy, cx-cpx, top, cx, top);
    plutovg_path_close(path);
}